

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O2

string * __thiscall
wabt::LoadStoreTracking::GenTypeDecl
          (string *__return_storage_ptr__,LoadStoreTracking *this,string *name)

{
  Type t;
  const_iterator cVar1;
  Index index;
  Index extraout_EDX;
  undefined8 extraout_RDX;
  wabt *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  _Rb_tree_node_base *p_Var2;
  undefined1 auVar3 [16];
  char *local_58;
  string local_50;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->vars)._M_t._M_impl.super__Rb_tree_header) {
    if (*(char *)&cVar1._M_node[3]._M_left == '\x01') {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"{ ",(allocator *)&local_50);
      auVar3._8_8_ = extraout_RDX;
      auVar3._0_8_ = cVar1._M_node[2]._M_right;
      while( true ) {
        p_Var2 = auVar3._0_8_;
        index = auVar3._8_4_;
        if (p_Var2 == (_Rb_tree_node_base *)&cVar1._M_node[2]._M_parent) break;
        if (*(int *)((long)&p_Var2[1]._M_left + 4) == 0) {
          this_00 = (wabt *)0x0;
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          this_00 = (wabt *)(ulong)*(uint *)((long)&p_Var2[1]._M_left + 4);
          index = extraout_EDX;
        }
        IndexToAlphaName_abi_cxx11_(&local_50,this_00,index);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        GetDecompTypeName((Type)*(Enum *)((long)&p_Var2[1]._M_parent + 4));
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        auVar3 = std::_Rb_tree_increment(p_Var2);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    t.enum_ = *(Enum *)((long)&cVar1._M_node[3]._M_left + 4);
    if (t.enum_ != Void) {
      local_58 = GetDecompTypeName(t);
      GenAlign_abi_cxx11_(&local_50,this,*(Address *)&cVar1._M_node[3]._M_right,
                          (Opcode)*(Enum *)((long)&cVar1._M_node[3]._M_right + 4));
      cat<char_const*,char[5],std::__cxx11::string>
                (__return_storage_ptr__,(wabt *)&local_58,(char **)"_ptr",(char (*) [5])&local_50,
                 in_R8);
      std::__cxx11::string::_M_dispose();
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeDecl(const std::string& name) const {
    auto it = vars.find(name);
    if (it == vars.end()) {
      return "";
    }
    if (it->second.struct_layout) {
      std::string s = "{ ";
      for (auto& access : it->second.accesses) {
        if (access.second.idx) s += ", ";
        s += IdxToName(access.second.idx);
        s += ':';
        s += GetDecompTypeName(access.second.type);
      }
      s += " }";
      return s;
    }
    // We don't have a struct layout, or the struct has just one field,
    // so maybe we can just declare it as a pointer to one type?
    if (it->second.same_type != Type::Void) {
      return cat(GetDecompTypeName(it->second.same_type), "_ptr",
                 GenAlign(it->second.same_align, it->second.last_opc));
    }
    return "";
  }